

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitBdd.c
# Opt level: O3

DdNode * Kit_SopToBdd(DdManager *dd,Kit_Sop_t *cSop,int nVars)

{
  uint uVar1;
  uint uVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  long lVar5;
  byte bVar6;
  DdNode *f;
  int i;
  
  if (0xf < nVars) {
    __assert_fail("nVars < 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitBdd.c"
                  ,0x38,"DdNode *Kit_SopToBdd(DdManager *, Kit_Sop_t *, int)");
  }
  pDVar3 = Cudd_ReadLogicZero(dd);
  Cudd_Ref(pDVar3);
  if (0 < cSop->nCubes) {
    lVar5 = 0;
    f = pDVar3;
    do {
      uVar1 = cSop->pCubes[lVar5];
      pDVar3 = f;
      if (uVar1 == 0) break;
      pDVar4 = Cudd_ReadOne(dd);
      Cudd_Ref(pDVar4);
      if (0 < nVars) {
        bVar6 = 0;
        i = 0;
        pDVar3 = pDVar4;
        do {
          uVar2 = uVar1 >> (bVar6 & 0x1f) & 3;
          if (uVar2 == 2) {
            pDVar4 = Cudd_bddIthVar(dd,i);
LAB_00554970:
            pDVar4 = Cudd_bddAnd(dd,pDVar3,pDVar4);
            Cudd_Ref(pDVar4);
            Cudd_RecursiveDeref(dd,pDVar3);
          }
          else {
            pDVar4 = pDVar3;
            if (uVar2 == 1) {
              pDVar4 = Cudd_bddIthVar(dd,i);
              pDVar4 = (DdNode *)((ulong)pDVar4 ^ 1);
              goto LAB_00554970;
            }
          }
          i = i + 1;
          bVar6 = bVar6 + 2;
          pDVar3 = pDVar4;
        } while (nVars != i);
      }
      pDVar3 = Cudd_bddOr(dd,f,pDVar4);
      Cudd_Ref(pDVar3);
      Cudd_RecursiveDeref(dd,f);
      Cudd_RecursiveDeref(dd,pDVar4);
      lVar5 = lVar5 + 1;
      f = pDVar3;
    } while (lVar5 < cSop->nCubes);
  }
  Cudd_Deref(pDVar3);
  return pDVar3;
}

Assistant:

DdNode * Kit_SopToBdd( DdManager * dd, Kit_Sop_t * cSop, int nVars )
{
    DdNode * bSum, * bCube, * bTemp, * bVar;
    unsigned uCube;
    int Value, i, v;
    assert( nVars < 16 );
    // start the cover
    bSum = Cudd_ReadLogicZero(dd);   Cudd_Ref( bSum );
   // check the logic function of the node
    Kit_SopForEachCube( cSop, uCube, i )
    {
        bCube = Cudd_ReadOne(dd);   Cudd_Ref( bCube );
        for ( v = 0; v < nVars; v++ )
        {
            Value = ((uCube >> 2*v) & 3);
            if ( Value == 1 )
                bVar = Cudd_Not( Cudd_bddIthVar( dd, v ) );
            else if ( Value == 2 )
                bVar = Cudd_bddIthVar( dd, v );
            else
                continue;
            bCube  = Cudd_bddAnd( dd, bTemp = bCube, bVar );   Cudd_Ref( bCube );
            Cudd_RecursiveDeref( dd, bTemp );
        }
        bSum = Cudd_bddOr( dd, bTemp = bSum, bCube );   
        Cudd_Ref( bSum );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
    }
    // complement the result if necessary
    Cudd_Deref( bSum );
    return bSum;
}